

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bipc.c
# Opt level: O0

void nn_bipc_handler(nn_fsm *self,int src,int type,void *srcptr)

{
  nn_list *self_00;
  uint in_EDX;
  uint in_ESI;
  long in_RDI;
  nn_aipc *aipc;
  nn_bipc *bipc;
  nn_list_item *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  nn_list_item *in_stack_ffffffffffffffa8;
  long local_30;
  
  local_30 = in_RDI;
  if (in_RDI == 0) {
    local_30 = 0;
  }
  if (*(int *)(local_30 + 0x58) == 1) {
    if (in_ESI != 0xfffffffe) {
      nn_backtrace_print();
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","src == NN_FSM_ACTION",
              "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/ipc/bipc.c"
              ,0xe8);
      fflush(_stderr);
      nn_err_abort();
    }
    if (in_EDX != 0xfffffffe) {
      nn_backtrace_print();
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","type == NN_FSM_START",
              "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/ipc/bipc.c"
              ,0xe9);
      fflush(_stderr);
      nn_err_abort();
    }
    *(undefined4 *)(local_30 + 0x58) = 2;
  }
  else {
    if (*(int *)(local_30 + 0x58) != 2) {
      nn_backtrace_print();
      fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected state",
              (ulong)*(uint *)(local_30 + 0x58),(ulong)in_ESI,(ulong)in_EDX,
              "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/ipc/bipc.c"
              ,0x112);
      fflush(_stderr);
      nn_err_abort();
    }
    if (in_ESI == 1) {
      if (in_EDX != 8 && in_EDX != 7) {
        nn_backtrace_print();
        fprintf(_stderr,"Assertion failed: %s (%s:%d)\n",
                "type == NN_USOCK_SHUTDOWN || type == NN_USOCK_STOPPED",
                "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/ipc/bipc.c"
                ,0xf3);
        fflush(_stderr);
        nn_err_abort();
      }
    }
    else {
      if (in_ESI != 2) {
        nn_backtrace_print();
        fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","src == NN_BIPC_SRC_AIPC",
                "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/ipc/bipc.c"
                ,0xf8);
        fflush(_stderr);
        nn_err_abort();
      }
      if (in_EDX == 0x85b7) {
        self_00 = (nn_list *)(local_30 + 0x2d0);
        nn_list_end((nn_list *)(local_30 + 0x2d0));
        nn_list_insert(self_00,in_stack_ffffffffffffffa8,
                       (nn_list_item *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0)
                      );
        *(undefined8 *)(local_30 + 0x2c8) = 0;
        nn_bipc_start_accepting((nn_bipc *)0x13cca9);
      }
      else if (in_EDX == 0x85b8) {
        nn_aipc_stop((nn_aipc *)0x13ccb8);
      }
      else {
        if (in_EDX != 0x85b9) {
          nn_backtrace_print();
          fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected action",
                  (ulong)*(uint *)(local_30 + 0x58),2,(ulong)in_EDX,
                  "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/ipc/bipc.c"
                  ,0x10b);
          fflush(_stderr);
          nn_err_abort();
        }
        nn_list_erase((nn_list *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                      in_stack_ffffffffffffff98);
        nn_aipc_term((nn_aipc *)0x13cce4);
        nn_free((void *)0x13ccee);
      }
    }
  }
  return;
}

Assistant:

static void nn_bipc_handler (struct nn_fsm *self, int src, int type,
    void *srcptr)
{
    struct nn_bipc *bipc;
    struct nn_aipc *aipc;

    bipc = nn_cont (self, struct nn_bipc, fsm);

    switch (bipc->state) {

/******************************************************************************/
/*  IDLE state.                                                               */
/******************************************************************************/
    case NN_BIPC_STATE_IDLE:
        nn_assert (src == NN_FSM_ACTION);
        nn_assert (type == NN_FSM_START);
        bipc->state = NN_BIPC_STATE_ACTIVE;
        return;

/******************************************************************************/
/*  ACTIVE state.                                                             */
/*  The execution is yielded to the aipc state machine in this state.         */
/******************************************************************************/
    case NN_BIPC_STATE_ACTIVE:
        if (src == NN_BIPC_SRC_USOCK) {
            nn_assert (type == NN_USOCK_SHUTDOWN || type == NN_USOCK_STOPPED);
            return;
        }

        /* All other events come from child aipc objects. */
        nn_assert (src == NN_BIPC_SRC_AIPC);
        aipc = (struct nn_aipc*) srcptr;
        switch (type) {
        case NN_AIPC_ACCEPTED:

            nn_list_insert (&bipc->aipcs, &aipc->item,
                nn_list_end (&bipc->aipcs));
            bipc->aipc = NULL;
            nn_bipc_start_accepting (bipc);
            return;
        case NN_AIPC_ERROR:
            nn_aipc_stop (aipc);
            return;
        case NN_AIPC_STOPPED:
            nn_list_erase (&bipc->aipcs, &aipc->item);
            nn_aipc_term (aipc);
            nn_free (aipc);
            return;
        default:
            nn_fsm_bad_action (bipc->state, src, type);
        }

/******************************************************************************/
/*  Invalid state.                                                            */
/******************************************************************************/
    default:
        nn_fsm_bad_state (bipc->state, src, type);
    }
}